

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O1

string * cmStrCat<char,std::__cxx11::string&,char_const(&)[14]>
                   (string *__return_storage_ptr__,char *a,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b,
                   char (*args) [14])

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  char local_88 [32];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_68;
  size_type local_50;
  pointer local_48;
  undefined8 local_40;
  size_t local_38;
  char (*local_30) [14];
  undefined8 local_28;
  
  local_88[0] = *a;
  local_68.first._M_str = local_88;
  local_68.first._M_len = 1;
  local_68.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_48 = (b->_M_dataplus)._M_p;
  local_50 = b->_M_string_length;
  local_40 = 0;
  local_38 = strlen(*args);
  local_28 = 0;
  views._M_len = 3;
  views._M_array = &local_68;
  local_30 = args;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}